

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.hpp
# Opt level: O2

data_ptr_t __thiscall
duckdb::FixedSizeAllocator::Get(FixedSizeAllocator *this,IndexPointer ptr,bool dirty)

{
  iterator iVar1;
  pointer this_00;
  data_ptr_t pdVar2;
  ulong local_20;
  
  local_20 = ptr.data & 0xffffffff;
  iVar1 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->buffers)._M_h,&local_20);
  this_00 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
            ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                          *)((long)iVar1.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                   ._M_cur + 0x10));
  pdVar2 = FixedSizeBuffer::Get(this_00,dirty);
  return pdVar2 + this->bitmask_offset +
                  (ulong)((uint)(ptr.data >> 0x20) & 0xffffff) * this->segment_size;
}

Assistant:

inline data_ptr_t Get(const IndexPointer ptr, const bool dirty = true) {
		D_ASSERT(ptr.GetOffset() < available_segments_per_buffer);
		D_ASSERT(buffers.find(ptr.GetBufferId()) != buffers.end());

		auto buffer_it = buffers.find(ptr.GetBufferId());
		D_ASSERT(buffer_it != buffers.end());
		auto buffer_ptr = buffer_it->second->Get(dirty);
		return buffer_ptr + ptr.GetOffset() * segment_size + bitmask_offset;
	}